

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AWS.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::AWS::Auth::readCertificateConfiguration
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Auth *this,Path *path)

{
  Client *client;
  string local_80;
  Path local_60;
  Url local_40;
  
  client = *(Client **)this;
  Vault::operator+(&local_80,"config/certificate/",path);
  local_60.value_._M_dataplus._M_p = (pointer)&local_60.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    local_60.value_.field_2._8_8_ = local_80.field_2._8_8_;
  }
  else {
    local_60.value_._M_dataplus._M_p = local_80._M_dataplus._M_p;
  }
  local_60.value_._M_string_length = local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  getUrl(&local_40,this,&local_60);
  HttpConsumer::get(__return_storage_ptr__,client,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::AWS::Auth::readCertificateConfiguration(const Path &path) {
  return HttpConsumer::get(client_, getUrl(Path{"config/certificate/" + path}));
}